

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  undefined1 auVar2 [16];
  Expression *args;
  bool bVar3;
  int iVar4;
  Delay3Control *pDVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  Diagnostic *diag;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  SourceRange SVar10;
  Expression *delays [3];
  Expression *local_58 [3];
  SourceRange local_40;
  
  if ((exprs->parameters).elements._M_extent._M_extent_value - 7 < 0xfffffffffffffffa) {
    SVar10 = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x540007,SVar10);
    local_58[0] = (Expression *)0x0;
    pDVar5 = (Delay3Control *)
             BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,(TimingControl **)local_58);
  }
  else {
    local_58[0] = (Expression *)0x0;
    local_58[1] = (Expression *)0x0;
    local_58[2] = (Expression *)0x0;
    pDVar5 = (Delay3Control *)((exprs->parameters).elements._M_extent._M_extent_value - 1);
    bVar9 = pDVar5 < (Delay3Control *)0xfffffffffffffffe;
    if (bVar9) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((exprs->parameters).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar8));
        SVar1 = (*ppSVar6)->kind;
        ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((exprs->parameters).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar8));
        if (SVar1 != OrderedParamAssignment) {
          SVar10 = slang::syntax::SyntaxNode::sourceRange(*ppSVar6);
          ASTContext::addDiag(context,(DiagCode)0x540007,SVar10);
LAB_003d2f19:
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_40.endLoc;
          local_40 = (SourceRange)(auVar2 << 0x40);
          pDVar5 = (Delay3Control *)
                   BumpAllocator::
                   emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                             (&compilation->super_BumpAllocator,(TimingControl **)&local_40);
          break;
        }
        iVar4 = Expression::bind((int)*(undefined8 *)(*ppSVar6 + 1),(sockaddr *)context,0);
        local_58[uVar7] = (Expression *)CONCAT44(extraout_var_00,iVar4);
        bVar3 = Type::isNumeric((((Expression *)CONCAT44(extraout_var_00,iVar4))->type).ptr);
        pDVar5 = (Delay3Control *)CONCAT71(extraout_var,bVar3);
        if (!bVar3) {
          diag = ASTContext::addDiag(context,(DiagCode)0x140008,local_58[uVar7]->sourceRange);
          ast::operator<<(diag,(local_58[uVar7]->type).ptr);
          goto LAB_003d2f19;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x30;
        bVar9 = uVar7 < (exprs->parameters).elements._M_extent._M_extent_value + 1 >> 1;
      } while (bVar9);
    }
    args = local_58[0];
    if (!bVar9) {
      local_40 = slang::syntax::SyntaxNode::sourceRange
                           (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
      pDVar5 = BumpAllocator::
               emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,args,local_58 + 1,local_58 + 2,&local_40
                         );
    }
  }
  return &pDVar5->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    SLANG_ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}